

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::tree_node<char,_false>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<char,false,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  char cVar1;
  uint32_t *puVar2;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar3;
  byte bVar4;
  internal_node<char,_false> *piVar5;
  rrb_size_table<false> *prVar6;
  rrb_size_table<false> *prVar7;
  leaf_node<char,_false> *plVar8;
  uint uVar9;
  int iVar10;
  ulong uVar12;
  uint32_t uVar13;
  long lVar14;
  ref<immutable::rrb_details::internal_node<char,_false>_> sliced_root;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_hand_node;
  ref<immutable::rrb_details::internal_node<char,_false>_> internal_root;
  ref<immutable::rrb_details::tree_node<char,_false>_> internal_root_child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ulong uVar11;
  
  bVar4 = (byte)shift & 0x1f;
  uVar9 = right >> bVar4;
  if (shift == 0) {
    internal_root.ptr = (internal_node<char,_false> *)root->ptr;
    if (internal_root.ptr != (internal_node<char,_false> *)0x0) {
      (internal_root.ptr)->_ref_count = (internal_root.ptr)->_ref_count + 1;
    }
    internal_root_child.ptr = (tree_node<char,_false> *)leaf_node_create<char,false>(uVar9 + 1);
    if ((leaf_node<char,_false> *)internal_root_child.ptr != (leaf_node<char,_false> *)0x0) {
      ((leaf_node<char,_false> *)internal_root_child.ptr)->_ref_count = 1;
    }
    for (uVar12 = 0; uVar9 + 1 != uVar12; uVar12 = uVar12 + 1) {
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&internal_root);
      cVar1 = plVar8->child[uVar12];
      plVar8 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)
                          &internal_root_child);
      plVar8->child[uVar12] = cVar1;
    }
    *total_shift = 0;
    *(tree_node<char,_false> **)this = internal_root_child.ptr;
    if (internal_root_child.ptr != (tree_node<char,_false> *)0x0) {
      (internal_root_child.ptr)->_ref_count = (internal_root_child.ptr)->_ref_count + 1;
    }
    release<char>((leaf_node<char,_false> *)internal_root_child.ptr);
    release<char>((leaf_node<char,_false> *)internal_root.ptr);
    return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
  }
  internal_root.ptr = (internal_node<char,_false> *)root->ptr;
  if (internal_root.ptr != (internal_node<char,_false> *)0x0) {
    (internal_root.ptr)->_ref_count = (internal_root.ptr)->_ref_count + 1;
  }
  piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal_root);
  if ((piVar5->size_table).ptr == (rrb_size_table<false> *)0x0) {
    piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal_root);
    uVar12 = (ulong)uVar9;
    internal_root_child.ptr = (tree_node<char,_false> *)piVar5->child[uVar12].ptr;
    if ((internal_node<char,_false> *)internal_root_child.ptr != (internal_node<char,_false> *)0x0)
    {
      ((internal_node<char,_false> *)internal_root_child.ptr)->_ref_count =
           ((internal_node<char,_false> *)internal_root_child.ptr)->_ref_count + 1;
    }
    rrb_drop_right_rec<char,false,5>
              ((rrb_details *)&right_hand_node,total_shift,&internal_root_child,
               right - (uVar9 << ((byte)shift & 0x1f)),shift - 5,right >> bVar4 != 0 || has_left);
    if (right >> bVar4 == 0) {
      if (!has_left) goto LAB_00143315;
      sliced_root.ptr = internal_node_create<char,false>(1);
      if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar5->child,
                 &right_hand_node);
    }
    else {
      sliced_root.ptr = internal_node_create<char,false>(uVar9 + 1);
      if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      for (lVar14 = 0; uVar12 * 8 != lVar14; lVar14 = lVar14 + 8) {
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (&internal_root);
        prVar3 = piVar5->child;
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&piVar5->child->ptr + lVar14),
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&prVar3->ptr + lVar14));
      }
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar5->child + uVar12),
                 &right_hand_node);
    }
    *total_shift = shift;
    *(internal_node<char,_false> **)this = sliced_root.ptr;
    if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
      (sliced_root.ptr)->_ref_count = (sliced_root.ptr)->_ref_count + 1;
    }
  }
  else {
    piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal_root);
    prVar7 = (piVar5->size_table).ptr;
    puVar2 = prVar7->size;
    uVar12 = (ulong)(uVar9 - 1);
    do {
      uVar11 = uVar12;
      iVar10 = (int)uVar11;
      uVar9 = iVar10 + 1;
      uVar12 = (ulong)uVar9;
    } while (puVar2[uVar12] <= right);
    uVar13 = right;
    if (uVar9 != 0) {
      uVar13 = right - puVar2[uVar11];
    }
    piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&internal_root);
    internal_root_child.ptr = (tree_node<char,_false> *)piVar5->child[uVar12].ptr;
    if ((internal_node<char,_false> *)internal_root_child.ptr != (internal_node<char,_false> *)0x0)
    {
      ((internal_node<char,_false> *)internal_root_child.ptr)->_ref_count =
           ((internal_node<char,_false> *)internal_root_child.ptr)->_ref_count + 1;
    }
    rrb_drop_right_rec<char,false,5>
              ((rrb_details *)&right_hand_node,total_shift,&internal_root_child,uVar13,shift - 5,
               uVar9 != 0 || has_left);
    if (uVar9 == 0) {
      if (!has_left) {
LAB_00143315:
        *(tree_node<char,_false> **)this = right_hand_node.ptr;
        if (right_hand_node.ptr != (tree_node<char,_false> *)0x0) {
          (right_hand_node.ptr)->_ref_count = (right_hand_node.ptr)->_ref_count + 1;
        }
        goto LAB_001432e5;
      }
      sliced_root.ptr = internal_node_create<char,false>(1);
      if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      sliced_table.ptr = size_table_create<false>(1);
      if (sliced_table.ptr != (rrb_size_table<false> *)0x0) {
        (sliced_table.ptr)->_ref_count = 1;
      }
      prVar7 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      *prVar7->size = right + 1;
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar5->size_table,&sliced_table);
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar5->child,
                 &right_hand_node);
      *total_shift = shift;
    }
    else {
      uVar13 = iVar10 + 2;
      sliced_root.ptr = internal_node_create<char,false>(uVar13);
      if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
        (sliced_root.ptr)->_ref_count = 1;
      }
      sliced_table.ptr = size_table_create<false>(uVar13);
      if (sliced_table.ptr != (rrb_size_table<false> *)0x0) {
        (sliced_table.ptr)->_ref_count = 1;
      }
      prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      memcpy(prVar6->size,prVar7->size,uVar12 * 4);
      prVar7 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table);
      prVar7->size[uVar12] = right + 1;
      for (lVar14 = 0; uVar12 << 3 != lVar14; lVar14 = lVar14 + 8) {
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           (&internal_root);
        prVar3 = piVar5->child;
        piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&piVar5->child->ptr + lVar14),
                   (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&prVar3->ptr + lVar14));
      }
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar5->size_table,&sliced_table);
      piVar5 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&sliced_root);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar5->child + uVar12),
                 &right_hand_node);
      *total_shift = shift;
    }
    *(internal_node<char,_false> **)this = sliced_root.ptr;
    if (sliced_root.ptr != (internal_node<char,_false> *)0x0) {
      (sliced_root.ptr)->_ref_count = (sliced_root.ptr)->_ref_count + 1;
    }
    release(sliced_table.ptr);
  }
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&sliced_root);
LAB_001432e5:
  ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&right_hand_node);
  ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&internal_root_child);
  ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&internal_root);
  return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }